

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# taskflow.hpp
# Opt level: O0

void __thiscall tf::Taskflow::Taskflow(Taskflow *this,string *name)

{
  string *in_RSI;
  FlowBuilder *in_RDI;
  queue<std::shared_ptr<tf::Topology>,_std::deque<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>_>
  *this_00;
  
  this_00 = (queue<std::shared_ptr<tf::Topology>,_std::deque<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>_>
             *)(in_RDI + 10);
  FlowBuilder::FlowBuilder(in_RDI,(Graph *)this_00);
  std::mutex::mutex((mutex *)0x10b527);
  std::__cxx11::string::string((string *)(in_RDI + 6),in_RSI);
  Graph::Graph((Graph *)0x10b548);
  std::
  queue<std::shared_ptr<tf::Topology>,std::deque<std::shared_ptr<tf::Topology>,std::allocator<std::shared_ptr<tf::Topology>>>>
  ::
  queue<std::deque<std::shared_ptr<tf::Topology>,std::allocator<std::shared_ptr<tf::Topology>>>,void>
            (this_00);
  std::optional<std::_List_iterator<tf::Taskflow>_>::optional
            ((optional<std::_List_iterator<tf::Taskflow>_> *)0x10b569);
  return;
}

Assistant:

inline Taskflow::Taskflow(const std::string& name) :
  FlowBuilder {_graph},
  _name       {name} {
}